

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_from_parent_path_alloc
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key **output)

{
  int iVar1;
  ext_key *key_out;
  
  if (output == (ext_key **)0x0) {
    iVar1 = -2;
  }
  else {
    key_out = (ext_key *)wally_calloc(0xc0);
    *output = key_out;
    if (key_out == (ext_key *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = bip32_key_from_parent_path(hdkey,child_path,child_path_len,flags,key_out);
      if (iVar1 != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int bip32_key_from_parent_path_alloc(const struct ext_key *hdkey,
                                     const uint32_t *child_path, size_t child_path_len,
                                     uint32_t flags,
                                     struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_from_parent_path(hdkey, child_path, child_path_len,
                                     flags, *output);
    if (ret != WALLY_OK) {
        wally_free(*output);
        *output = NULL;
    }
    return ret;
}